

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xstring.c
# Opt level: O2

int capacity_expand(xstr_t *xs,size_t size)

{
  ulong uVar1;
  char *pcVar2;
  ulong __size;
  
  __size = xs->capacity * 2;
  uVar1 = xs->size + size + 1;
  if (__size <= uVar1) {
    __size = uVar1;
  }
  pcVar2 = (char *)realloc(xs->data,__size);
  if (pcVar2 != (char *)0x0) {
    xs->data = pcVar2;
    xs->capacity = __size;
  }
  return (int)pcVar2;
}

Assistant:

static int capacity_expand(xstr_t* xs, size_t size)
{
    size_t new_cap = xs->capacity << 1; /* xs->capacity * 2; */
    void* new_data;

    size += xs->size + 1; /* leave 1 null-terminated */

    if (new_cap < size) new_cap = size;

    new_data = realloc(xs->data, new_cap);

    if (new_data)
    {
        xs->data = new_data;
        xs->capacity = new_cap;
        return 0;
    }

    return -1;
}